

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuregistrarproxy_p.cpp
# Opt level: O3

int __thiscall
QDBusMenuRegistrarInterface::qt_metacall
          (QDBusMenuRegistrarInterface *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  undefined8 *puVar1;
  undefined4 in_register_00000014;
  
  _id_00 = QDBusAbstractInterface::qt_metacall
                     ((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id_00 < 4) {
      if (_id_00 == 2) {
        puVar1 = (undefined8 *)*_a;
        if (*_a[1] == 1) {
          *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusObjectPath>::metaType;
          goto LAB_006356c3;
        }
      }
      else {
        puVar1 = (undefined8 *)*_a;
      }
      *puVar1 = 0;
    }
  }
  else {
    if (_c != InvokeMetaMethod) {
      return _id_00;
    }
    if (_id_00 < 4) {
      qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
    }
  }
LAB_006356c3:
  return _id_00 - 4;
}

Assistant:

int QDBusMenuRegistrarInterface::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDBusAbstractInterface::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}